

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_can_test.cpp
# Opt level: O1

ssize_t __thiscall SocketCAN::Writer::send(Writer *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ulong uVar1;
  void *extraout_RDX;
  void *__buf_00;
  undefined4 in_register_00000034;
  undefined8 *__src;
  ulong uVar2;
  uint uVar3;
  can_frame frame;
  undefined8 local_38;
  undefined8 uStack_30;
  
  __src = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  uStack_30 = 0;
  uVar3 = (uint)__buf & 7;
  uVar1 = (ulong)this->_id;
  local_38._0_5_ = CONCAT14(8,this->_id);
  local_38 = (ulong)(uint5)local_38;
  if ((void *)0x7 < __buf) {
    uVar2 = (ulong)__buf >> 3;
    do {
      uStack_30 = *__src;
      uVar1 = Socket::write(&this->_socket,(int)&local_38,__buf,__n);
      __src = __src + 1;
      uVar2 = uVar2 - 1;
      __buf = extraout_RDX;
    } while (uVar2 != 0);
  }
  if ((ulong)uVar3 != 0) {
    local_38._0_5_ = CONCAT14((char)uVar3,(undefined4)local_38);
    memcpy(&uStack_30,__src,(ulong)uVar3);
    uVar1 = Socket::write(&this->_socket,(int)&local_38,__buf_00,__n);
  }
  return uVar1;
}

Assistant:

void send(const __u8* data, size_t size) {
    struct can_frame frame{0};
    const size_t     maxDataLen = CAN_MAX_DLEN;

    const size_t fullDataFrameNumb = size/CAN_MAX_DLEN;
    const size_t lastDataFrameSize = size%CAN_MAX_DLEN;
    const __u8* srcDataPtr = data;

    frame.can_id  = _id;
    frame.can_dlc = static_cast<__u8>(maxDataLen);
    for (size_t ii = 0; ii < fullDataFrameNumb; ++ii) {
      memcpy(frame.data, srcDataPtr, maxDataLen);
      _socket.write(&frame);
      srcDataPtr += maxDataLen;
    }

    if (lastDataFrameSize > 0) {
      frame.can_dlc = static_cast<__u8>(lastDataFrameSize);
      memcpy(frame.data, srcDataPtr, lastDataFrameSize);
      _socket.write(&frame);
    }

  }